

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O3

void __thiscall nuraft::snapshot_io_mgr::async_io_loop(snapshot_io_mgr *this)

{
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  *this_00;
  size_t *psVar1;
  atomic<bool> *paVar2;
  int32 iVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  ulong offset;
  element_type *peVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  __atomic_base<unsigned_long> _Var11;
  raft_server *prVar12;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  pthread_t __target_thread;
  snapshot_sync_req *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  iterator iVar17;
  _Node *p_Var18;
  element_type *peVar19;
  _List_node_base *p_Var20;
  _List_node_base *p_Var21;
  void **ppvVar22;
  iterator __position;
  pthread_mutex_t *__mutex;
  bool bVar23;
  bool is_last_request;
  int dst_id;
  unique_lock<std::recursive_mutex> guard_1;
  unique_lock<std::mutex> lock;
  ptr<buffer> data;
  ulong term;
  unique_lock<std::recursive_mutex> guard;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  reqs_to_return;
  list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  reqs;
  ptr<req_msg> req;
  string thread_name;
  bool local_166;
  log_val_type local_165;
  uint local_164;
  long *local_160;
  string local_158;
  undefined1 local_131;
  snapshot_sync_req *local_130;
  undefined1 local_128 [24];
  undefined1 local_110;
  __shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> local_108;
  snapshot_io_mgr *local_f8;
  unsigned_long local_f0;
  unique_lock<std::recursive_mutex> local_e8;
  _List_node_base local_d8;
  long local_c8;
  _List_node_base local_c0;
  undefined8 local_b0;
  ptr<peer> local_a8;
  ptr<req_msg> local_98;
  pthread_mutex_t *local_88;
  _func_int **local_80;
  _func_int **local_78;
  _List_node_base *local_70;
  char *local_68 [2];
  char local_58 [16];
  undefined8 local_48;
  ulong uStack_40;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"nuraft_snp_io","");
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,local_68[0]);
  __mutex = (pthread_mutex_t *)&this->queue_lock_;
  this_00 = &this->queue_;
  local_78 = (_func_int **)&PTR___Sp_counted_ptr_inplace_0061c4f0;
  local_80 = (_func_int **)&PTR__req_msg_0061c540;
  local_f8 = this;
  local_88 = __mutex;
  do {
    EventAwaiter::wait_us
              ((this->io_thread_ea_).
               super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1000000);
    LOCK();
    (((this->io_thread_ea_).super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->status)._M_i = idle;
    UNLOCK();
    local_b0 = 0;
    local_c8 = 0;
    p_Var20 = &local_c0;
    local_d8._M_next = &local_d8;
    local_d8._M_prev = &local_d8;
    local_c0._M_next = &local_c0;
    local_c0._M_prev = &local_c0;
    if (((this->terminating_)._M_base._M_i & 1U) == 0) {
      iVar14 = pthread_mutex_lock(__mutex);
      if (iVar14 != 0) {
        std::__throw_system_error(iVar14);
      }
      if (&local_c0 != (_List_node_base *)this_00) {
        std::__cxx11::
        list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
        ::
        _M_assign_dispatch<std::_List_const_iterator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                  ((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                    *)&local_c0,
                   (this_00->
                   super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                   )._M_impl._M_node.super__List_node_base._M_next,this_00);
      }
      pthread_mutex_unlock(__mutex);
      p_Var20 = local_c0._M_next;
    }
    while ((p_Var20 != &local_c0 && (((this->terminating_)._M_base._M_i & 1U) == 0))) {
      p_Var21 = p_Var20 + 1;
      peVar4 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var21->_M_next)->_M_ptr->raft_).
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar4->leader_).super___atomic_base<int>._M_i != peVar4->id_) ||
         ((peVar4->role_)._M_i != leader)) break;
      peVar5 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var21->_M_next)->_M_ptr->dst_).
               super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_164 = *(uint *)(peVar5->config_).
                           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_128._16_8_ = &peVar5->lock_;
      local_110 = 0;
      local_70 = p_Var20;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_128 + 0x10));
      local_110 = 1;
      peVar19 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var21->_M_next)->_M_ptr;
      peVar6 = (peVar19->sync_ctx_).
               super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_160 = (long *)(((peVar19->raft_).
                            super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->l_).
                          super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      offset = (peVar6->field_2).offset_;
      ppvVar22 = &peVar6->user_snp_ctx_;
      if ((local_160 != (long *)0x0) && (iVar14 = (**(code **)(*local_160 + 0x38))(), 4 < iVar14)) {
        msg_if_given_abi_cxx11_
                  (&local_158,"peer: %d, obj_idx: %lu, user_snp_ctx %p",(ulong)local_164,offset,
                   *ppvVar22);
        (**(code **)(*local_160 + 0x40))
                  (local_160,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                   ,"async_io_loop",0xb8,&local_158);
        if (local_158._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
          operator_delete(local_158._M_dataplus._M_p);
        }
      }
      peVar7 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var21->_M_next)->_M_ptr->snapshot_).
               super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar8 = peVar7->last_log_idx_;
      uVar9 = peVar7->last_log_term_;
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)(local_128 + 0x10));
      local_108._M_ptr = (element_type *)0x0;
      local_108._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_166 = false;
      peVar19 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var21->_M_next)->_M_ptr;
      plVar10 = (long *)(((peVar19->raft_).
                          super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->state_machine_).
                        super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      iVar14 = (**(code **)(*plVar10 + 0x70))
                         (plVar10,(peVar19->snapshot_).
                                  super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,ppvVar22,offset,&local_108,&local_166);
      if (iVar14 < 0) {
        if (local_160 != (long *)0x0) {
          iVar15 = (**(code **)(*local_160 + 0x38))();
          if (2 < iVar15) {
            msg_if_given_abi_cxx11_
                      (&local_158,
                       "reading snapshot (idx %lu, term %lu, object %lu) for peer %d failed: %d",
                       uVar8,uVar9,offset,(ulong)local_164,iVar14);
            (**(code **)(*local_160 + 0x40))
                      (local_160,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                       ,"async_io_loop",0xca,&local_158);
            if (local_158._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
              operator_delete(local_158._M_dataplus._M_p);
            }
          }
        }
        local_158._M_string_length._0_1_ = 0;
        local_158._M_dataplus._M_p =
             (pointer)&((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                           *)&p_Var21->_M_next)->_M_ptr->raft_).
                        super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->lock_;
        std::unique_lock<std::recursive_mutex>::lock
                  ((unique_lock<std::recursive_mutex> *)&local_158);
        local_158._M_string_length._0_1_ = 1;
        iVar17 = std::
                 _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                              *)&p_Var21->_M_next)->_M_ptr->raft_).
                           super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->peers_)._M_h,(key_type_conflict *)&local_164);
        this = local_f8;
        peVar19 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                    *)&p_Var21->_M_next)->_M_ptr;
        prVar12 = (peVar19->raft_).
                  super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (iVar17.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
            _M_cur == (__node_type *)0x0) {
          LOCK();
          (prVar12->srv_to_join_snp_retry_required_)._M_base._M_i = true;
          UNLOCK();
          prVar12 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                       *)&p_Var21->_M_next)->_M_ptr->raft_).
                    super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          raft_server::enable_hb_for_peer
                    (prVar12,(prVar12->srv_to_join_).
                             super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        else {
          raft_server::clear_snapshot_sync_ctx
                    (prVar12,(peVar19->dst_).
                             super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&local_158);
        iVar14 = 5;
      }
      else {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_ptr !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          buffer::pos(local_108._M_ptr,0);
        }
        local_e8._M_device =
             &((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2> *
                 )&p_Var21->_M_next)->_M_ptr->raft_).
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->lock_;
        local_e8._M_owns = false;
        std::unique_lock<std::recursive_mutex>::lock(&local_e8);
        local_e8._M_owns = true;
        local_f0 = *(unsigned_long *)
                    ((long)(((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                *)&p_Var21->_M_next)->_M_ptr->raft_).
                             super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->state_).
                           super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    + 8);
        _Var11._M_i = (((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                           *)&p_Var21->_M_next)->_M_ptr->raft_).
                        super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
        this_01 = (snapshot_sync_req *)operator_new(0x30);
        snapshot_sync_req::snapshot_sync_req
                  (this_01,&((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                              *)&p_Var21->_M_next)->_M_ptr->snapshot_,offset,
                   (ptr<buffer> *)&local_108,local_166);
        peVar19 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                    *)&p_Var21->_M_next)->_M_ptr;
        peVar4 = (peVar19->raft_).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar7 = (peVar19->snapshot_).
                 super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_48 = peVar7->last_log_idx_;
        uStack_40 = peVar7->last_log_term_;
        local_130 = this_01;
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
        p_Var16->_M_use_count = 1;
        p_Var16->_M_weak_count = 1;
        p_Var16->_vptr__Sp_counted_base = local_78;
        local_98.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var16 + 1);
        iVar3 = peVar4->id_;
        p_Var16[1]._M_use_count = (undefined4)local_f0;
        p_Var16[1]._M_weak_count = local_f0._4_4_;
        *(undefined4 *)&p_Var16[2]._vptr__Sp_counted_base = 0x10;
        *(int32 *)((long)&p_Var16[2]._vptr__Sp_counted_base + 4) = iVar3;
        p_Var16[2]._M_use_count = local_164;
        p_Var16[1]._vptr__Sp_counted_base = local_80;
        *(undefined4 *)&p_Var16[3]._vptr__Sp_counted_base = (undefined4)uStack_40;
        *(_Atomic_word *)((long)&p_Var16[3]._vptr__Sp_counted_base + 4) = local_48._4_4_;
        p_Var16[3]._M_use_count = (_Atomic_word)local_48;
        p_Var16[3]._M_weak_count = local_48._4_4_;
        p_Var16[4]._vptr__Sp_counted_base = (_func_int **)_Var11._M_i;
        *(undefined1 (*) [16])&p_Var16[4]._M_use_count = (undefined1  [16])0x0;
        p_Var16[5]._M_use_count = 0;
        p_Var16[5]._M_weak_count = 0;
        local_98.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var16;
        snapshot_sync_req::serialize((snapshot_sync_req *)local_128);
        local_165 = snp_sync_req;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_158._M_string_length;
        local_158._0_16_ = auVar13 << 0x40;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,unsigned_long&,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_158 + 8),
                   (log_entry **)&local_158,(allocator<nuraft::log_entry> *)&local_131,&local_f0,
                   (shared_ptr<nuraft::buffer> *)local_128,&local_165);
        this = local_f8;
        std::
        vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
        ::emplace_back<std::shared_ptr<nuraft::log_entry>>
                  ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                    *)&p_Var16[4]._M_use_count,(shared_ptr<nuraft::log_entry> *)&local_158);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
        }
        paVar2 = &((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                      *)&p_Var21->_M_next)->_M_ptr->dst_).
                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->busy_flag_;
        LOCK();
        bVar23 = (paVar2->_M_base)._M_i == false;
        if (bVar23) {
          (paVar2->_M_base)._M_i = true;
        }
        UNLOCK();
        if (bVar23) {
          peVar5 = (((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                      *)&p_Var21->_M_next)->_M_ptr->dst_).
                   super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_128._0_8_ = (element_type *)0x0;
          local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_158.field_2 =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )0x0;
          local_158._0_16_ = (unique_lock<std::recursive_mutex>)0x0;
          (peVar5->rsv_msg_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(peVar5->rsv_msg_).
                      super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
          std::
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          ::operator=(&peVar5->rsv_msg_handler_,
                      (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                       *)&local_158);
          if ((code *)local_158.field_2._M_allocated_capacity != (code *)0x0) {
            (*(code *)local_158.field_2._M_allocated_capacity)(&local_158,&local_158,3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
          }
          peVar19 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                      *)&p_Var21->_M_next)->_M_ptr;
          local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (peVar19->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (peVar19->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
              peVar19 = ((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                          *)&p_Var21->_M_next)->_M_ptr;
            }
            else {
              (local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          peer::send_req(local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,&local_a8,&local_98,&peVar19->handler_);
          if (local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          timer_helper::reset(&((((__shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
                                   *)&p_Var21->_M_next)->_M_ptr->dst_).
                                super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                               ->last_sent_timer_);
          if ((local_160 != (long *)0x0) &&
             (iVar14 = (**(code **)(*local_160 + 0x38))(), 5 < iVar14)) {
            msg_if_given_abi_cxx11_(&local_158,"bg thread sent message to peer %d",(ulong)local_164)
            ;
            (**(code **)(*local_160 + 0x40))
                      (local_160,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                       ,"async_io_loop",0xf5,&local_158);
            if (local_158._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
              operator_delete(local_158._M_dataplus._M_p);
            }
          }
        }
        else {
          if ((local_160 != (long *)0x0) &&
             (iVar14 = (**(code **)(*local_160 + 0x38))(), 4 < iVar14)) {
            msg_if_given_abi_cxx11_
                      (&local_158,"peer %d is busy, push the request back to queue",(ulong)local_164
                      );
            (**(code **)(*local_160 + 0x40))
                      (local_160,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/snapshot_sync_ctx.cxx"
                       ,"async_io_loop",0xf8,&local_158);
            if (local_158._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
              operator_delete(local_158._M_dataplus._M_p);
            }
          }
          p_Var18 = std::__cxx11::
                    list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                    ::_M_create_node<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>const&>
                              ((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                                *)&local_d8,
                               (shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *)p_Var21);
          std::__detail::_List_node_base::_M_hook(&p_Var18->super__List_node_base);
          local_c8 = local_c8 + 1;
        }
        if (local_98.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_130 != (snapshot_sync_req *)0x0) {
          std::default_delete<nuraft::snapshot_sync_req>::operator()
                    ((default_delete<nuraft::snapshot_sync_req> *)&local_130,local_130);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_e8);
        iVar14 = 0;
      }
      if (local_108._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_refcount._M_pi);
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_128 + 0x10));
      if ((iVar14 != 5) && (iVar14 != 0)) break;
      p_Var20 = local_70->_M_next;
    }
    __mutex = local_88;
    iVar14 = pthread_mutex_lock(local_88);
    p_Var20 = local_c0._M_next;
    if (iVar14 != 0) {
      std::__throw_system_error(iVar14);
    }
    for (; p_Var21 = local_d8._M_next, __position._M_node = (_List_node_base *)this_00,
        p_Var20 != &local_c0; p_Var20 = p_Var20->_M_next) {
      do {
        __position._M_node = (__position._M_node)->_M_next;
        if (__position._M_node == (_List_node_base *)this_00) goto LAB_0023b56a;
      } while (__position._M_node[1]._M_next != p_Var20[1]._M_next);
      std::__cxx11::
      list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
      ::_M_erase(this_00,__position);
LAB_0023b56a:
    }
    for (; p_Var21 != &local_d8; p_Var21 = p_Var21->_M_next) {
      p_Var18 = std::__cxx11::
                list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                ::_M_create_node<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>const&>
                          ((list<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>>>
                            *)this_00,
                           (shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem> *)(p_Var21 + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var18->super__List_node_base);
      psVar1 = &(this->queue_).
                super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    pthread_mutex_unlock(__mutex);
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::_M_clear((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)&local_d8);
    std::__cxx11::
    _List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
    ::_M_clear((_List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
                *)&local_c0);
    if (((this->terminating_)._M_base._M_i & 1U) != 0) {
      if (local_68[0] != local_58) {
        operator_delete(local_68[0]);
      }
      return;
    }
  } while( true );
}

Assistant:

void snapshot_io_mgr::async_io_loop() {
    std::string thread_name = "nuraft_snp_io";
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    do {
        io_thread_ea_->wait_ms(1000);
        io_thread_ea_->reset();

        std::list< ptr<io_queue_elem> > reqs;
        std::list< ptr<io_queue_elem> > reqs_to_return;
        if (!terminating_) {
            auto_lock(queue_lock_);
            reqs = queue_;
        }

        for (ptr<io_queue_elem>& elem: reqs) {
            if (terminating_) {
                break;
            }
            if (!elem->raft_->is_leader()) {
                break;
            }

            int dst_id = elem->dst_->get_id();

            std::unique_lock<std::mutex> lock(elem->dst_->get_lock());
            // ---- lock acquired
            logger* l_ = elem->raft_->l_.get();
            ulong obj_idx = elem->sync_ctx_->get_offset();
            void*& user_snp_ctx = elem->sync_ctx_->get_user_snp_ctx();
            p_db("peer: %d, obj_idx: %" PRIu64 ", user_snp_ctx %p",
                 dst_id, obj_idx, user_snp_ctx);

            ulong snp_log_idx = elem->snapshot_->get_last_log_idx();
            ulong snp_log_term = elem->snapshot_->get_last_log_term();
            // ---- lock released
            lock.unlock();

            ptr<buffer> data = nullptr;
            bool is_last_request = false;

            int rc = elem->raft_->state_machine_->read_logical_snp_obj
                     ( *elem->snapshot_, user_snp_ctx, obj_idx,
                       data, is_last_request );
            if (rc < 0) {
                // Snapshot read failed.
                p_wn( "reading snapshot (idx %" PRIu64 ", term %" PRIu64
                      ", object %" PRIu64 ") "
                      "for peer %d failed: %d",
                      snp_log_idx, snp_log_term, obj_idx, dst_id, rc );

                recur_lock(elem->raft_->lock_);
                auto entry = elem->raft_->peers_.find(dst_id);
                if (entry != elem->raft_->peers_.end()) {
                    // If normal member (already in the peer list):
                    //   reset the `sync_ctx` so as to retry with the newer version.
                    elem->raft_->clear_snapshot_sync_ctx(*elem->dst_);
                } else {
                    // If it is joing the server (not in the peer list),
                    // enable HB temporarily to retry the request.
                    elem->raft_->srv_to_join_snp_retry_required_ = true;
                    elem->raft_->enable_hb_for_peer(*elem->raft_->srv_to_join_);
                }

                continue;
            }
            if (data) data->pos(0);

            // Send snapshot message with the given response handler.
            recur_lock(elem->raft_->lock_);
            ulong term = elem->raft_->state_->get_term();
            ulong commit_idx = elem->raft_->quick_commit_index_;

            std::unique_ptr<snapshot_sync_req> sync_req(
                new snapshot_sync_req( elem->snapshot_, obj_idx,
                                       data, is_last_request ) );
            ptr<req_msg> req( cs_new<req_msg>
                              ( term,
                                msg_type::install_snapshot_request,
                                elem->raft_->id_,
                                dst_id,
                                elem->snapshot_->get_last_log_term(),
                                elem->snapshot_->get_last_log_idx(),
                                commit_idx ) );
            req->log_entries().push_back( cs_new<log_entry>
                                          ( term,
                                            sync_req->serialize(),
                                            log_val_type::snp_sync_req ) );
            if (elem->dst_->make_busy()) {
                elem->dst_->set_rsv_msg(nullptr, nullptr);
                elem->dst_->send_req(elem->dst_, req, elem->handler_);
                elem->dst_->reset_ls_timer();
                p_tr("bg thread sent message to peer %d", dst_id);

            } else {
                p_db("peer %d is busy, push the request back to queue", dst_id);
                reqs_to_return.push_back(elem);
            }
        }

        {
            auto_lock(queue_lock_);
            // Remove elements in `reqs` from `queue_`.
            for (auto& entry: reqs) {
                auto e2 = queue_.begin();
                while (e2 != queue_.end()) {
                    if (*e2 == entry) {
                        e2 = queue_.erase(e2);
                        break;
                    } else {
                        e2++;
                    }
                }
            }
            // Return elements in `reqs_to_return` to `queue_` for retrying.
            for (auto& entry: reqs_to_return) {
                queue_.push_back(entry);
            }
        }

    } while (!terminating_);
}